

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O1

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t _elemsize;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  LRN *pLVar6;
  pointer piVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  void *pvVar14;
  Mat *pMVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  Mat *pMVar22;
  bool bVar23;
  float fVar24;
  ulong local_188;
  allocator_type local_179;
  Mat local_178;
  ulong local_128;
  Mat *local_120;
  Mat *local_118;
  Mat *local_110;
  long local_108;
  void *local_100;
  ulong local_f8;
  LRN *local_f0;
  Mat local_e8;
  long local_98;
  void *local_90;
  long local_88;
  void *local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar21 = bottom_top_blob->w;
  local_128 = (ulong)(uint)bottom_top_blob->h;
  uVar16 = bottom_top_blob->c;
  pMVar22 = (Mat *)(ulong)uVar16;
  _elemsize = bottom_top_blob->elemsize;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,uVar21,bottom_top_blob->h,uVar16,_elemsize,opt->workspace_allocator);
  iVar9 = -100;
  if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0)) goto LAB_0032ec7a;
  uVar20 = (int)local_128 * uVar21;
  if (0 < (int)uVar16) {
    pvVar10 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    pMVar15 = (Mat *)0x0;
    pvVar14 = local_e8.data;
    do {
      if (0 < (int)uVar20) {
        uVar19 = 0;
        do {
          fVar1 = *(float *)((long)pvVar10 + uVar19 * 4);
          *(float *)((long)pvVar14 + uVar19 * 4) = fVar1 * fVar1;
          uVar19 = uVar19 + 1;
        } while (uVar20 != uVar19);
      }
      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
      pvVar14 = (void *)((long)pvVar14 +
                        local_e8.cstep *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
      pvVar10 = (void *)((long)pvVar10 + sVar3 * sVar4);
    } while (pMVar15 != pMVar22);
  }
  local_f0 = this;
  if (this->region_type == 0) {
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    Mat::create(&local_178,uVar21,(int)local_128,uVar16,_elemsize,opt->workspace_allocator);
    bVar23 = (long)local_178.c * local_178.cstep == 0;
    if (local_178.data == (void *)0x0 || bVar23) {
      piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if (local_178.data != (void *)0x0) {
              free(local_178.data);
            }
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar9 = -100;
      local_178.cstep = 0;
      local_178.data = (void *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.elemsize._0_4_ = 0;
      local_178.elemsize._4_4_ = 0;
      local_178.elempack = 0;
      local_178.dims = 0;
      local_178.w = 0;
      local_178.h = 0;
      local_178.d = 0;
      local_178.c = 0;
      goto LAB_0032ec7a;
    }
    local_120 = (Mat *)CONCAT71(local_120._1_7_,local_178.data == (void *)0x0 || bVar23);
    if (0 < local_178.c * (int)local_178.cstep) {
      memset(local_178.data,0,(ulong)(uint)(local_178.c * (int)local_178.cstep) << 2);
    }
    if (0 < (int)uVar16) {
      fVar1 = local_f0->alpha;
      iVar9 = local_f0->local_size;
      uVar21 = iVar9 / 2;
      local_f8 = (ulong)-uVar21;
      pvVar10 = bottom_top_blob->data;
      local_108 = (long)(int)uVar21;
      local_128 = local_178.cstep *
                  CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
      local_100 = (void *)(bottom_top_blob->cstep * bottom_top_blob->elemsize);
      pMVar15 = (Mat *)0x0;
      pvVar14 = local_178.data;
      local_110 = pMVar22;
      do {
        pLVar6 = local_f0;
        uVar16 = (int)local_f8 + (int)pMVar15;
        if ((long)(int)uVar16 <= (long)((long)&pMVar15->data + local_108)) {
          do {
            if ((uVar16 < (uint)local_110) && (0 < (int)uVar20)) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar14 + uVar19 * 4) =
                     *(float *)((long)pvVar14 + uVar19 * 4) +
                     *(float *)((long)local_e8.data +
                               uVar19 * 4 +
                               (ulong)uVar16 *
                               local_e8.cstep *
                               CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
                uVar19 = uVar19 + 1;
              } while (uVar20 != uVar19);
            }
            bVar23 = uVar16 != uVar21;
            uVar16 = uVar16 + 1;
          } while (bVar23);
        }
        local_118 = pMVar15;
        if (0 < (int)uVar20) {
          uVar19 = 0;
          do {
            fVar24 = powf(*(float *)((long)pvVar14 + uVar19 * 4) * fVar1 * (1.0 / (float)iVar9) +
                          pLVar6->bias,-pLVar6->beta);
            *(float *)((long)pvVar10 + uVar19 * 4) = fVar24 * *(float *)((long)pvVar10 + uVar19 * 4)
            ;
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
        uVar21 = uVar21 + 1;
        pMVar15 = (Mat *)((long)&local_118->data + 1);
        pvVar14 = (void *)((long)pvVar14 + local_128);
        pvVar10 = (void *)((long)pvVar10 + (long)local_100);
      } while (pMVar15 != local_110);
    }
    piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar9 = -100;
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    if ((char)local_120 != '\0') goto LAB_0032ec7a;
  }
  else if (this->region_type == 1) {
    piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    local_178.data = local_e8.data;
    local_178.refcount._0_4_ = local_e8.refcount._0_4_;
    local_178.refcount._4_4_ = local_e8.refcount._4_4_;
    local_178.elemsize._0_4_ = (undefined4)local_e8.elemsize;
    local_178.elemsize._4_4_ = local_e8.elemsize._4_4_;
    local_178.elempack = local_e8.elempack;
    local_178.allocator = local_e8.allocator;
    local_178.dims = local_e8.dims;
    local_178.w = local_e8.w;
    local_178.h = local_e8.h;
    local_178.d = local_e8.d;
    local_178.c = local_e8.c;
    local_178.cstep = local_e8.cstep;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    uVar16 = this->local_size;
    uVar20 = uVar21;
    local_118 = bottom_top_blob;
    if (1 < (int)uVar16) {
      uVar20 = uVar16 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_e8,&local_178,uVar20,~uVar20 + uVar16,uVar20,~uVar20 + uVar16,0,0.0,
                       (Option *)&_space_ofs);
      uVar20 = local_178.w;
      if (local_178.data == (void *)0x0 || (long)local_178.c * local_178.cstep == 0) {
        piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              if (local_178.data != (void *)0x0) {
                free(local_178.data);
              }
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar9 = -100;
        local_178.cstep = 0;
        local_178.data = (void *)0x0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.dims = 0;
        local_178.w = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        goto LAB_0032ec7a;
      }
    }
    iVar9 = this->local_size;
    uVar16 = iVar9 * iVar9;
    fVar1 = this->alpha;
    local_110 = pMVar22;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar16,&local_179);
    piVar7 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = this->local_size;
    if (0 < iVar2) {
      iVar8 = 0;
      iVar11 = 0;
      iVar13 = 0;
      do {
        if (0 < this->local_size) {
          lVar18 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar13 + lVar18] = iVar11 + (int)lVar18;
            lVar18 = lVar18 + 1;
            iVar17 = (int)lVar18;
          } while (iVar17 < this->local_size);
          iVar13 = iVar13 + iVar17;
          iVar11 = iVar11 + iVar17;
        }
        iVar11 = iVar11 + (uVar20 - iVar2);
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->local_size);
    }
    if (0 < (int)local_110) {
      local_f8 = (ulong)(int)uVar21;
      local_80 = local_118->data;
      local_88 = local_118->cstep * local_118->elemsize;
      local_90 = local_178.data;
      local_98 = local_178.cstep * CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize)
      ;
      local_108 = (long)local_178.w *
                  CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
      local_118 = (Mat *)CONCAT44(local_118._4_4_,1.0 / (float)(int)uVar16);
      local_120 = (Mat *)0x0;
      do {
        if (0 < (int)local_128) {
          local_100 = (void *)(local_98 * (long)local_120 + (long)local_90);
          pvVar10 = (void *)(local_88 * (long)local_120 + (long)local_80);
          local_188 = 0;
          do {
            pvVar14 = local_100;
            if (0 < (int)uVar21) {
              lVar18 = local_108 * local_188;
              uVar19 = 0;
              do {
                if (iVar9 == 0) {
                  fVar24 = 0.0;
                }
                else {
                  fVar24 = 0.0;
                  uVar12 = 0;
                  do {
                    fVar24 = fVar24 + *(float *)((long)pvVar14 +
                                                (long)piVar7[uVar12] * 4 + uVar19 * 4 + lVar18);
                    uVar12 = uVar12 + 1;
                  } while (uVar16 + (uVar16 == 0) != uVar12);
                }
                fVar24 = powf(fVar24 * fVar1 * local_118._0_4_ + local_f0->bias,-local_f0->beta);
                *(float *)((long)pvVar10 + uVar19 * 4) =
                     fVar24 * *(float *)((long)pvVar10 + uVar19 * 4);
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar21);
            }
            pvVar10 = (void *)((long)pvVar10 + local_f8 * 4);
            local_188 = local_188 + 1;
          } while (local_188 != local_128);
        }
        local_120 = (Mat *)((long)&local_120->data + 1);
      } while (local_120 != local_110);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
  }
  iVar9 = 0;
LAB_0032ec7a:
  piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar9;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i = 0; i < size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * powf(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            opt_b.use_packing_layout = false;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}